

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v6::internal::bigint::square(bigint *this)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint *puVar4;
  bigit *pbVar5;
  ulong uVar6;
  buffer<unsigned_int> *in_RDI;
  bool bVar7;
  int i_1;
  int j_1;
  int bigit_index_1;
  int j;
  int i;
  int bigit_index;
  accumulator_t sum;
  int num_result_bigits;
  int num_bigits;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> n;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  bigit bVar8;
  bigint *in_stack_fffffffffffffec0;
  bigint *in_stack_fffffffffffffed0;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  ulong local_d8;
  ulong local_d0;
  buffer<unsigned_int> local_a8 [5];
  
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::basic_memory_buffer
            (&in_stack_fffffffffffffec0->bigits_,
             (basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  sVar3 = buffer<unsigned_int>::size(in_RDI);
  iVar2 = (int)sVar3;
  to_unsigned<int>(iVar2 * 2);
  buffer<unsigned_int>::resize
            ((buffer<unsigned_int> *)in_stack_fffffffffffffec0,
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  local_d0 = 0;
  local_d8 = 0;
  for (local_dc = 0; local_e8 = iVar2, local_dc < iVar2; local_dc = local_dc + 1) {
    local_e0 = 0;
    for (local_e4 = local_dc; -1 < local_e4; local_e4 = local_e4 + -1) {
      puVar4 = buffer<unsigned_int>::operator[]<int>(local_a8,local_e0);
      uVar1 = *puVar4;
      puVar4 = buffer<unsigned_int>::operator[]<int>(local_a8,local_e4);
      bVar7 = CARRY8(local_d8,(ulong)uVar1 * (ulong)*puVar4);
      local_d8 = local_d8 + (ulong)uVar1 * (ulong)*puVar4;
      local_d0 = local_d0 + bVar7;
      local_e0 = local_e0 + 1;
    }
    pbVar5 = operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    *pbVar5 = (bigit)local_d8;
    local_d8 = local_d0 << 0x20 | local_d8 >> 0x20;
    local_d0 = local_d0 >> 0x20;
  }
  for (; local_e8 < iVar2 * 2; local_e8 = local_e8 + 1) {
    local_f0 = local_e8 - (iVar2 + -1);
    local_ec = iVar2 + -1;
    while (local_f0 < iVar2) {
      puVar4 = buffer<unsigned_int>::operator[]<int>(local_a8,local_f0);
      uVar1 = *puVar4;
      in_stack_fffffffffffffed0 = (bigint *)buffer<unsigned_int>::operator[]<int>(local_a8,local_ec)
      ;
      uVar6 = (ulong)uVar1 *
              (ulong)*(uint *)&(in_stack_fffffffffffffed0->bigits_).super_buffer<unsigned_int>.
                               _vptr_buffer;
      bVar7 = CARRY8(local_d8,uVar6);
      local_d8 = local_d8 + uVar6;
      local_d0 = local_d0 + bVar7;
      local_f0 = local_f0 + 1;
      local_ec = local_ec + -1;
    }
    bVar8 = (bigit)local_d8;
    in_stack_fffffffffffffec0 = (bigint *)operator[](in_stack_fffffffffffffec0,(bigit)local_d8);
    *(bigit *)&(in_stack_fffffffffffffec0->bigits_).super_buffer<unsigned_int>._vptr_buffer = bVar8;
    local_d8 = local_d0 << 0x20 | local_d8 >> 0x20;
    local_d0 = local_d0 >> 0x20;
  }
  remove_leading_zeros(in_stack_fffffffffffffed0);
  *(int *)&in_RDI[5]._vptr_buffer = *(int *)&in_RDI[5]._vptr_buffer << 1;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::~basic_memory_buffer
            (&in_stack_fffffffffffffec0->bigits_);
  return;
}

Assistant:

void square() {
    basic_memory_buffer<bigit, bigits_capacity> n(std::move(bigits_));
    int num_bigits = static_cast<int>(bigits_.size());
    int num_result_bigits = 2 * num_bigits;
    bigits_.resize(to_unsigned(num_result_bigits));
    using accumulator_t = conditional_t<FMT_USE_INT128, uint128_t, accumulator>;
    auto sum = accumulator_t();
    for (int bigit_index = 0; bigit_index < num_bigits; ++bigit_index) {
      // Compute bigit at position bigit_index of the result by adding
      // cross-product terms n[i] * n[j] such that i + j == bigit_index.
      for (int i = 0, j = bigit_index; j >= 0; ++i, --j) {
        // Most terms are multiplied twice which can be optimized in the future.
        sum += static_cast<double_bigit>(n[i]) * n[j];
      }
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;  // Compute the carry.
    }
    // Do the same for the top half.
    for (int bigit_index = num_bigits; bigit_index < num_result_bigits;
         ++bigit_index) {
      for (int j = num_bigits - 1, i = bigit_index - j; i < num_bigits;)
        sum += static_cast<double_bigit>(n[i++]) * n[j--];
      (*this)[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;
    }
    --num_result_bigits;
    remove_leading_zeros();
    exp_ *= 2;
  }